

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O0

char * option_type_name(int page)

{
  char *local_18;
  char *result;
  int page_local;
  
  switch(page) {
  case 0:
    local_18 = "interface";
    break;
  case 1:
    local_18 = "birth";
    break;
  case 2:
    local_18 = "cheat";
    break;
  case 3:
    local_18 = "score";
    break;
  case 4:
    local_18 = "special";
    break;
  default:
    local_18 = "unknown";
  }
  return local_18;
}

Assistant:

const char *option_type_name(int page)
{
	const char *result;

	switch (page) {
	case OP_INTERFACE:
		result = "interface";
		break;

	case OP_BIRTH:
		result = "birth";
		break;

	case OP_CHEAT:
		result = "cheat";
		break;

	case OP_SCORE:
		result = "score";
		break;

	case OP_SPECIAL:
		result = "special";
		break;

	default:
		result = "unknown";
		break;
	}

	return result;
}